

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdGetSchnorrPubkeyFromPubkey(void *handle,char *pubkey,char **schnorr_pubkey,bool *parity)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  SchnorrPubkey schnorr_pubkey_obj;
  Pubkey pubkey_obj;
  undefined1 local_80 [32];
  SchnorrPubkey local_60;
  Pubkey local_48;
  
  cfd::Initialize();
  if (schnorr_pubkey == (char **)0x0) {
    local_80._0_8_ = "cfdcapi_key.cpp";
    local_80._8_4_ = 0x1c2;
    local_80._16_8_ = "CfdGetSchnorrPubkeyFromPubkey";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"schnorr pubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Failed to parameter. schnorr pubkey is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_80,pubkey,(allocator *)&local_60);
    cfd::core::Pubkey::Pubkey(&local_48,(string *)local_80);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    cfd::core::SchnorrPubkey::FromPubkey(&local_60,&local_48,parity);
    cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_80,&local_60);
    pcVar2 = cfd::capi::CreateString((string *)local_80);
    *schnorr_pubkey = pcVar2;
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
    if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_80._0_8_ = "cfdcapi_key.cpp";
  local_80._8_4_ = 0x1c8;
  local_80._16_8_ = "CfdGetSchnorrPubkeyFromPubkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"pubkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"Failed to parameter. pubkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSchnorrPubkeyFromPubkey(
    void* handle, const char* pubkey, char** schnorr_pubkey, bool* parity) {
  try {
    cfd::Initialize();
    if (schnorr_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "schnorr pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. schnorr pubkey is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    Pubkey pubkey_obj = Pubkey(std::string(pubkey));
    SchnorrPubkey schnorr_pubkey_obj =
        SchnorrPubkey::FromPubkey(pubkey_obj, parity);
    *schnorr_pubkey = CreateString(schnorr_pubkey_obj.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}